

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse-2-typedefs.cpp
# Opt level: O0

Result<wasm::Ok> *
wasm::WATParser::parseTypeDefs
          (Result<wasm::Ok> *__return_storage_ptr__,ParseDeclsCtx *decls,Lexer *input,
          IndexMap *typeIndices,vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *types,
          unordered_map<wasm::HeapType,_std::unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_std::unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>_>_>_>
          *typeNames)

{
  uint uVar1;
  Module *pMVar2;
  unordered_map<unsigned_int,_wasm::Name,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>_>
  *this;
  value_type *pvVar3;
  bool bVar4;
  size_type n;
  reference pDVar5;
  ostream *os;
  reference pvVar6;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *__x;
  value_type *pvVar7;
  size_type sVar8;
  reference pvVar9;
  mapped_type *this_00;
  reference ppVar10;
  pair<std::__detail::_Node_iterator<std::pair<const_wasm::Name,_unsigned_int>,_false,_true>,_bool>
  pVar11;
  Ok local_451;
  _Node_iterator_base<std::pair<const_wasm::Name,_unsigned_int>,_true> local_450;
  undefined1 local_448;
  pair<const_wasm::Name,_unsigned_int> local_440;
  type *local_428;
  type *name;
  type *idx;
  size_t sStack_410;
  char *local_408;
  _Node_iterator_base<std::pair<const_unsigned_int,_wasm::Name>,_false> local_400;
  iterator __end4;
  iterator __begin4;
  unordered_map<unsigned_int,_wasm::Name,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>_>
  *__range4;
  mapped_type *fieldIdxMap;
  pair<const_wasm::HeapType,_wasm::TypeNames> local_3d0;
  unordered_map<unsigned_int,_wasm::Name,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>_>
  *local_380;
  unordered_map<unsigned_int,_wasm::Name,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>_>
  *fieldNames;
  value_type *names;
  size_t i;
  Err local_348;
  stringstream local_328 [8];
  stringstream msg;
  ostream local_318 [376];
  Error *local_1a0;
  Error *err_1;
  BuildResult built;
  Err local_170;
  Err *local_150;
  Err *err;
  MaybeResult<wasm::Ok> _val;
  WithPosition<wasm::WATParser::ParseTypeDefsCtx> with;
  DefPos *recType;
  iterator __end2;
  iterator __begin2;
  vector<wasm::WATParser::DefPos,_std::allocator<wasm::WATParser::DefPos>_> *__range2;
  undefined1 local_c8 [8];
  ParseTypeDefsCtx ctx;
  TypeBuilder builder;
  unordered_map<wasm::HeapType,_std::unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_std::unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>_>_>_>
  *typeNames_local;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *types_local;
  IndexMap *typeIndices_local;
  Lexer *input_local;
  ParseDeclsCtx *decls_local;
  
  n = std::vector<wasm::WATParser::DefPos,_std::allocator<wasm::WATParser::DefPos>_>::size
                (&decls->typeDefs);
  TypeBuilder::TypeBuilder((TypeBuilder *)&ctx.index,n);
  ParseTypeDefsCtx::ParseTypeDefsCtx
            ((ParseTypeDefsCtx *)local_c8,input,(TypeBuilder *)&ctx.index,typeIndices);
  __end2 = std::vector<wasm::WATParser::DefPos,_std::allocator<wasm::WATParser::DefPos>_>::begin
                     (&decls->recTypeDefs);
  recType = (DefPos *)
            std::vector<wasm::WATParser::DefPos,_std::allocator<wasm::WATParser::DefPos>_>::end
                      (&decls->recTypeDefs);
  while (bVar4 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<wasm::WATParser::DefPos_*,_std::vector<wasm::WATParser::DefPos,_std::allocator<wasm::WATParser::DefPos>_>_>
                                     *)&recType), bVar4) {
    pDVar5 = __gnu_cxx::
             __normal_iterator<wasm::WATParser::DefPos_*,_std::vector<wasm::WATParser::DefPos,_std::allocator<wasm::WATParser::DefPos>_>_>
             ::operator*(&__end2);
    WithPosition<wasm::WATParser::ParseTypeDefsCtx>::WithPosition
              ((WithPosition<wasm::WATParser::ParseTypeDefsCtx> *)
               ((long)&_val.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20),
               (ParseTypeDefsCtx *)local_c8,pDVar5->pos);
    rectype<wasm::WATParser::ParseTypeDefsCtx>
              ((MaybeResult<wasm::Ok> *)&err,(ParseTypeDefsCtx *)local_c8);
    local_150 = MaybeResult<wasm::Ok>::getErr((MaybeResult<wasm::Ok> *)&err);
    bVar4 = local_150 != (Err *)0x0;
    if (bVar4) {
      wasm::Err::Err(&local_170,local_150);
      Result<wasm::Ok>::Result(__return_storage_ptr__,&local_170);
      wasm::Err::~Err(&local_170);
    }
    built.
    super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
    .
    super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
    .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
    super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
    super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
    super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
    super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>._29_3_ = 0;
    built.
    super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
    .
    super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
    .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
    super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
    super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
    super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
    super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>._28_1_ =
         bVar4;
    MaybeResult<wasm::Ok>::~MaybeResult((MaybeResult<wasm::Ok> *)&err);
    if (built.
        super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
        .
        super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
        .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
        super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
        super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
        super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
        super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>._28_4_
        == 0) {
      built.
      super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
      .
      super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
      .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
      super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
      super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
      super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
      super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>._28_4_ = 0
      ;
    }
    WithPosition<wasm::WATParser::ParseTypeDefsCtx>::~WithPosition
              ((WithPosition<wasm::WATParser::ParseTypeDefsCtx> *)
               ((long)&_val.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20));
    if (built.
        super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
        .
        super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
        .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
        super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
        super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
        super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
        super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>._28_4_
        != 0) goto LAB_023f06ba;
    __gnu_cxx::
    __normal_iterator<wasm::WATParser::DefPos_*,_std::vector<wasm::WATParser::DefPos,_std::allocator<wasm::WATParser::DefPos>_>_>
    ::operator++(&__end2);
  }
  TypeBuilder::build((BuildResult *)&err_1,(TypeBuilder *)&ctx.index);
  local_1a0 = TypeBuilder::BuildResult::getError((BuildResult *)&err_1);
  if (local_1a0 == (Error *)0x0) {
    __x = TypeBuilder::BuildResult::operator*((BuildResult *)&err_1);
    std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::operator=(types,__x);
    for (names = (value_type *)0x0; pvVar3 = names,
        pvVar7 = (value_type *)
                 std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::size(types),
        pvVar3 < pvVar7; names = (value_type *)((long)&(names->name).super_IString.str._M_len + 1))
    {
      fieldNames = (unordered_map<unsigned_int,_wasm::Name,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>_>
                    *)std::vector<wasm::TypeNames,_std::allocator<wasm::TypeNames>_>::operator[]
                                ((vector<wasm::TypeNames,_std::allocator<wasm::TypeNames>_> *)
                                 &ctx.builder,(size_type)names);
      local_380 = &((reference)fieldNames)->fieldNames;
      bVar4 = IString::is((IString *)fieldNames);
      if ((bVar4) ||
         (sVar8 = std::
                  unordered_map<unsigned_int,_wasm::Name,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>_>
                  ::size(local_380), sVar8 != 0)) {
        pMVar2 = decls->wasm;
        pvVar9 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::operator[]
                           (types,(size_type)names);
        std::pair<const_wasm::HeapType,_wasm::TypeNames>::
        pair<wasm::HeapType_&,_wasm::TypeNames_&,_true>(&local_3d0,pvVar9,(TypeNames *)fieldNames);
        std::
        unordered_map<wasm::HeapType,_wasm::TypeNames,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::TypeNames>_>_>
        ::insert(&pMVar2->typeNames,&local_3d0);
        std::pair<const_wasm::HeapType,_wasm::TypeNames>::~pair(&local_3d0);
        pvVar9 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::operator[]
                           (types,(size_type)names);
        this_00 = std::
                  unordered_map<wasm::HeapType,_std::unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_std::unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>_>_>_>
                  ::operator[](typeNames,pvVar9);
        this = local_380;
        __end4 = std::
                 unordered_map<unsigned_int,_wasm::Name,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>_>
                 ::begin(local_380);
        local_400._M_cur =
             (__node_type *)
             std::
             unordered_map<unsigned_int,_wasm::Name,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>_>
             ::end(this);
        while (bVar4 = std::__detail::operator!=
                                 (&__end4.
                                   super__Node_iterator_base<std::pair<const_unsigned_int,_wasm::Name>,_false>
                                  ,&local_400), bVar4) {
          ppVar10 = std::__detail::
                    _Node_iterator<std::pair<const_unsigned_int,_wasm::Name>,_false,_false>::
                    operator*(&__end4);
          local_408 = (ppVar10->second).super_IString.str._M_str;
          idx = *(type **)ppVar10;
          sStack_410 = (ppVar10->second).super_IString.str._M_len;
          name = (type *)std::get<0ul,unsigned_int_const,wasm::Name>
                                   ((pair<const_unsigned_int,_wasm::Name> *)&idx);
          local_428 = std::get<1ul,unsigned_int_const,wasm::Name>
                                ((pair<const_unsigned_int,_wasm::Name> *)&idx);
          std::pair<const_wasm::Name,_unsigned_int>::pair<wasm::Name_&,_true>
                    (&local_440,local_428,(uint *)name);
          pVar11 = std::
                   unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>
                   ::insert(this_00,&local_440);
          local_450._M_cur =
               (__node_type *)
               pVar11.first.
               super__Node_iterator_base<std::pair<const_wasm::Name,_unsigned_int>,_true>._M_cur;
          local_448 = pVar11.second;
          std::__detail::_Node_iterator<std::pair<const_unsigned_int,_wasm::Name>,_false,_false>::
          operator++(&__end4);
        }
      }
    }
    Result<wasm::Ok>::Result<wasm::Ok>(__return_storage_ptr__,&local_451);
    built.
    super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
    .
    super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
    .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
    super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
    super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
    super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
    super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>._28_4_ = 1;
  }
  else {
    std::__cxx11::stringstream::stringstream(local_328);
    os = std::operator<<(local_318,"invalid type: ");
    wasm::operator<<(os,local_1a0->reason);
    pvVar6 = std::vector<wasm::WATParser::DefPos,_std::allocator<wasm::WATParser::DefPos>_>::
             operator[](&decls->typeDefs,local_1a0->index);
    uVar1 = pvVar6->pos;
    std::__cxx11::stringstream::str();
    Lexer::err(&local_348,(Lexer *)&ctx,(ulong)uVar1,(string *)&i);
    Result<wasm::Ok>::Result(__return_storage_ptr__,&local_348);
    wasm::Err::~Err(&local_348);
    std::__cxx11::string::~string((string *)&i);
    built.
    super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
    .
    super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
    .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
    super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
    super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
    super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
    super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>._28_4_ = 1;
    std::__cxx11::stringstream::~stringstream(local_328);
  }
  TypeBuilder::BuildResult::~BuildResult((BuildResult *)&err_1);
LAB_023f06ba:
  ParseTypeDefsCtx::~ParseTypeDefsCtx((ParseTypeDefsCtx *)local_c8);
  TypeBuilder::~TypeBuilder((TypeBuilder *)&ctx.index);
  return __return_storage_ptr__;
}

Assistant:

Result<> parseTypeDefs(
  ParseDeclsCtx& decls,
  Lexer& input,
  IndexMap& typeIndices,
  std::vector<HeapType>& types,
  std::unordered_map<HeapType, std::unordered_map<Name, Index>>& typeNames) {
  TypeBuilder builder(decls.typeDefs.size());
  ParseTypeDefsCtx ctx(input, builder, typeIndices);
  for (auto& recType : decls.recTypeDefs) {
    WithPosition with(ctx, recType.pos);
    CHECK_ERR(rectype(ctx));
  }
  auto built = builder.build();
  if (auto* err = built.getError()) {
    std::stringstream msg;
    msg << "invalid type: " << err->reason;
    return ctx.in.err(decls.typeDefs[err->index].pos, msg.str());
  }
  types = *built;
  // Record type names on the module and in typeNames.
  for (size_t i = 0; i < types.size(); ++i) {
    auto& names = ctx.names[i];
    auto& fieldNames = names.fieldNames;
    if (names.name.is() || fieldNames.size()) {
      decls.wasm.typeNames.insert({types[i], names});
      auto& fieldIdxMap = typeNames[types[i]];
      for (auto [idx, name] : fieldNames) {
        fieldIdxMap.insert({name, idx});
      }
    }
  }
  return Ok{};
}